

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

u16string * anon_unknown.dwarf_d849::codecvt_u8_to_u16(u16string *__return_storage_ptr__,string *u8)

{
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  local_78;
  byte_string *local_18;
  string *u8_local;
  
  local_18 = u8;
  u8_local = (string *)__return_storage_ptr__;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::wstring_convert(&local_78);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::from_bytes(__return_storage_ptr__,&local_78,local_18);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_78);
  return __return_storage_ptr__;
}

Assistant:

inline
u16string codecvt_u8_to_u16(const string& u8)
{
    using codecvt = std::codecvt_utf8_utf16<char16_t>;
    return std::wstring_convert<codecvt, char16_t>{}.from_bytes(u8);
}